

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpputest_starter_test.cpp
# Opt level: O0

void __thiscall TEST_CppUTestStarter_Sample_Test::testBody(TEST_CppUTestStarter_Sample_Test *this)

{
  Options *this_00;
  Options *local_78;
  undefined8 uStack_70;
  Options *options;
  undefined8 contents;
  
  options = (Options *)0x0;
  contents = (int *)0x0;
  local_78 = (Options *)0x0;
  uStack_70._0_1_ = (_Alloc_hider)0x0;
  uStack_70._1_7_ = 0;
  this_00 = (Options *)&local_78;
  ApprovalTests::Options::Options((Options *)0x0);
  ApprovalTests::TApprovals<ApprovalTests::ToStringCompileTimeOptions<ApprovalTests::StringMaker>>::
  verify<int,int>((int *)contents,options);
  ApprovalTests::Options::~Options(this_00);
  return;
}

Assistant:

TEST(CppUTestStarter, Sample)
{
    // TODO Replace 42 with the value or object whose contents you are verifying.
    // For help, see:
    // https://approvaltestscpp.readthedocs.io/en/latest/generated_docs/ToString.html
    ApprovalTests::Approvals::verify(42);
}